

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SerializeMessageNoTable(MessageLite *msg,ArrayOutput *output)

{
  int iVar1;
  undefined4 extraout_var;
  CodedOutputStream o;
  ArrayOutputStream array_stream;
  
  io::ArrayOutputStream::ArrayOutputStream(&array_stream,output->ptr,0x7fffffff,-1);
  io::CodedOutputStream::CodedOutputStream(&o,&array_stream.super_ZeroCopyOutputStream);
  o.impl_.is_serialization_deterministic_ = output->is_deterministic;
  iVar1 = (*msg->_vptr_MessageLite[0xb])(msg,o.cur_,&o);
  o.cur_ = (uint8_t *)CONCAT44(extraout_var,iVar1);
  iVar1 = io::CodedOutputStream::ByteCount(&o);
  output->ptr = output->ptr + iVar1;
  io::CodedOutputStream::~CodedOutputStream(&o);
  return;
}

Assistant:

void SerializeMessageNoTable(const MessageLite* msg, ArrayOutput* output) {
  io::ArrayOutputStream array_stream(output->ptr, INT_MAX);
  io::CodedOutputStream o(&array_stream);
  o.SetSerializationDeterministic(output->is_deterministic);
  msg->SerializeWithCachedSizes(&o);
  output->ptr += o.ByteCount();
}